

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall MakefileGenerator::processSources(MakefileGenerator *this)

{
  bool bVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_ffffffffffffffbf;
  QMakeProject *this_00;
  char *in_stack_ffffffffffffffe0;
  MakefileGenerator *in_stack_ffffffffffffffe8;
  char *ch;
  
  ch = *(char **)(in_FS_OFFSET + 0x28);
  this_00 = (QMakeProject *)in_RDI[9].d.d;
  QString::QString((QString *)this_00,ch);
  bVar1 = QMakeProject::isActiveConfig(this_00,in_RDI,(bool)in_stack_ffffffffffffffbf);
  QString::~QString((QString *)0x1811f1);
  if (!bVar1) {
    filterIncludedFiles(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    filterIncludedFiles(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != ch) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MakefileGenerator::processSources()
{
    if (project->isActiveConfig("compile_included_sources"))
        return;

    filterIncludedFiles("SOURCES");
    filterIncludedFiles("GENERATED_SOURCES");
}